

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Code.cpp
# Opt level: O0

bool isValidCode(string *str)

{
  code *pcVar1;
  ulong uVar2;
  char *pcVar3;
  long local_28;
  long count;
  unsigned_long i;
  string *str_local;
  
  local_28 = 0;
  for (count = 0; uVar2 = std::__cxx11::string::length(), (ulong)count < uVar2; count = count + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
    if (*pcVar3 == '(') {
      local_28 = local_28 + 1;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
      if (*pcVar3 == ')') {
        local_28 = local_28 + -1;
      }
    }
  }
  if (local_28 < 0) {
    __assert_fail("count >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Final/src/Code.cpp"
                  ,0x11,"bool isValidCode(std::string &)");
  }
  if (local_28 == 0) {
    str_local._7_1_ = true;
  }
  else {
    if (local_28 < 1) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool isValidCode(std::string &str) {
    unsigned long i = 0;
    long count = 0;
    for (i = 0; i < str.length(); i++) {
        if (str[i] == '(') {
            count++;
        } else if (str[i] == ')') {
            count--;
        }
    }
    assert(count >= 0);
    if (count == 0) {
        return true;
    } else if (count > 0) {
        return false;
    }
}